

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O2

uint32_t cueify_toc_get_track_address(cueify_toc *t,uint8_t track)

{
  uint32_t uVar1;
  cueify_toc_private *toc;
  cueify_toc *ppvVar2;
  
  uVar1 = 0;
  if (t != (cueify_toc *)0x0) {
    if ((track < *(byte *)t) || (*(byte *)((long)t + 1) < track)) {
      if (track != 0xaa) {
        return 0;
      }
      ppvVar2 = t + 1;
    }
    else {
      ppvVar2 = t + (ulong)track + 1;
    }
    uVar1 = *(uint32_t *)ppvVar2;
  }
  return uVar1;
}

Assistant:

uint32_t cueify_toc_get_track_address(cueify_toc *t, uint8_t track) {
    cueify_toc_private *toc = (cueify_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (track >= toc->first_track_number &&
	       track <= toc->last_track_number) {
	return toc->tracks[track].lba;
    } else if (track == CUEIFY_LEAD_OUT_TRACK) {
	return toc->tracks[0].lba;
    } else {
	return 0;
    }
}